

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiColumns::ImGuiColumns(ImGuiColumns *this)

{
  (this->HostClipRect).Min.x = 3.4028235e+38;
  (this->HostClipRect).Min.y = 3.4028235e+38;
  (this->HostClipRect).Max.x = -3.4028235e+38;
  (this->HostClipRect).Max.y = -3.4028235e+38;
  (this->HostWorkRect).Min.x = 3.4028235e+38;
  (this->HostWorkRect).Min.y = 3.4028235e+38;
  (this->HostWorkRect).Max.x = -3.4028235e+38;
  (this->HostWorkRect).Max.y = -3.4028235e+38;
  (this->Columns).Size = 0;
  (this->Columns).Capacity = 0;
  (this->Columns).Data = (ImGuiColumnData *)0x0;
  Clear(this);
  return;
}

Assistant:

static inline ImU32     ImHash(const void* data, int size, ImU32 seed = 0) { return size ? ImHashData(data, (size_t)size, seed) : ImHashStr((const char*)data, 0, seed); }